

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

void __thiscall
Inline::SetupInlineeFrame
          (Inline *this,Func *inlinee,Instr *inlineeStart,ArgSlot actualCount,Opnd *functionObject)

{
  StackSym *stackSym;
  SymOpnd *newDst;
  Instr *this_00;
  undefined6 in_register_0000000a;
  long lVar1;
  Opnd *local_68;
  Opnd *srcs [3];
  ArgSlot local_36 [4];
  ArgSlot argSlots [3];
  
  IR::IntConstOpnd::New
            (CONCAT62(in_register_0000000a,actualCount) & 0xffffffff,TyInt16,inlinee,true);
  srcs[0] = (Opnd *)0x0;
  srcs[1] = &IR::AddrOpnd::NewNull(inlinee)->super_Opnd;
  for (lVar1 = -3; lVar1 != 0; lVar1 = lVar1 + 1) {
    stackSym = SymTable::GetArgSlotSym(inlinee->m_symTable,argSlots[lVar1 + -1]);
    stackSym->field_0x19 = stackSym->field_0x19 | 0x40;
    Func::SetArgOffset(this->topFunc,stackSym,
                       (this->currentInlineeFrameSlot + (int)lVar1) * 8 + 0x18);
    newDst = IR::SymOpnd::New(&stackSym->super_Sym,0,
                              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                              [lVar1],inlinee);
    this_00 = IR::Instr::New(InlineeMetaArg,inlinee);
    IR::Instr::SetDst(this_00,&newDst->super_Opnd);
    if (srcs[lVar1 + 2] != (Opnd *)0x0) {
      IR::Instr::SetSrc1(this_00,srcs[lVar1 + 2]);
    }
    IR::Instr::InsertBefore(inlineeStart,this_00);
    if (lVar1 == -3) {
      Func::SetInlineeFrameStartSym(inlinee,stackSym);
    }
  }
  return;
}

Assistant:

void
Inline::SetupInlineeFrame(Func *inlinee, IR::Instr *inlineeStart, Js::ArgSlot actualCount, IR::Opnd *functionObject)
{
    Js::ArgSlot argSlots[Js::Constants::InlineeMetaArgCount] = {
        actualCount + 1u, /* argc */
        actualCount + 2u, /* function object */
        actualCount + 3u  /* arguments object slot */
    };

    IR::Opnd *srcs[Js::Constants::InlineeMetaArgCount] = {
        IR::IntConstOpnd::New(actualCount, TyInt16, inlinee, true /*dontEncode*/),

        /*
         * Don't initialize this slot with the function object yet. In compat mode we evaluate
         * the target only after evaluating all arguments. Having this SymOpnd here ensures it gets
         * the correct slot in the frame. Lowerer fills this slot with the function object just
         * before entering the inlinee when we're sure we've evaluated the target in all modes.
         */
        nullptr,

        IR::AddrOpnd::NewNull(inlinee)
    };

    const IRType types[Js::Constants::InlineeMetaArgCount] = {
        TyMachReg,
        TyVar,
        TyMachReg
    };

    for (unsigned instrIndex = 0; instrIndex < Js::Constants::InlineeMetaArgCount; instrIndex++)
    {
        StackSym    *stackSym = inlinee->m_symTable->GetArgSlotSym(argSlots[instrIndex]);
        stackSym->m_isInlinedArgSlot = true;
        this->topFunc->SetArgOffset(stackSym, (currentInlineeFrameSlot + instrIndex) * MachPtr);
        IR::SymOpnd *symOpnd  = IR::SymOpnd::New(stackSym, 0, types[instrIndex], inlinee);

        IR::Instr   *instr    = IR::Instr::New(Js::OpCode::InlineeMetaArg, inlinee);
        instr->SetDst(symOpnd);
        if (srcs[instrIndex])
        {
            instr->SetSrc1(srcs[instrIndex]);
        }
        inlineeStart->InsertBefore(instr);

        if (instrIndex == 0)
        {
            inlinee->SetInlineeFrameStartSym(stackSym);
        }
    }
}